

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

void __thiscall
wasm::Precompute::reuseConstantNode<wasm::Break>(Precompute *this,Break *curr,Flow *flow)

{
  bool bVar1;
  size_t sVar2;
  Literal *other;
  Module *module;
  Expression *pEVar3;
  bool local_a3;
  string_view local_88;
  RefFunc *local_78;
  RefFunc *r;
  HeapType local_68;
  char *local_60;
  RefNull *local_58;
  RefNull *n;
  Const *local_40;
  Const *c;
  Literal singleValue;
  Flow *flow_local;
  Break *curr_local;
  Precompute *this_local;
  
  singleValue.type.id = (uintptr_t)flow;
  bVar1 = Literals::isConcrete(&flow->values);
  if (!bVar1) {
    curr->value = (Expression *)0x0;
    goto LAB_0195d359;
  }
  if (curr->value != (Expression *)0x0) {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)flow);
    if (sVar2 == 1) {
      other = Flow::getSingleValue(flow);
      wasm::Literal::Literal((Literal *)&c,other);
      bVar1 = wasm::Type::isNumber((Type *)&singleValue.field_0.func.super_IString.str._M_str);
      if (bVar1) {
        local_40 = Expression::dynCast<wasm::Const>(curr->value);
        if (local_40 == (Const *)0x0) goto LAB_0195d304;
        wasm::Literal::operator=(&local_40->value,(Literal *)&c);
        Const::finalize(local_40);
        Break::finalize(curr);
        n._0_4_ = 1;
      }
      else {
        bVar1 = wasm::Literal::isNull((Literal *)&c);
        if (bVar1) {
          local_58 = Expression::dynCast<wasm::RefNull>(curr->value);
          if (local_58 == (RefNull *)0x0) goto LAB_0195d304;
          local_60 = singleValue.field_0.func.super_IString.str._M_str;
          RefNull::finalize(local_58,(Type)singleValue.field_0.gcData.
                                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
          Break::finalize(curr);
          n._0_4_ = 1;
        }
        else {
          bVar1 = wasm::Type::isRef((Type *)&singleValue.field_0.func.super_IString.str._M_str);
          local_a3 = false;
          if (bVar1) {
            local_68 = wasm::Type::getHeapType
                                 ((Type *)&singleValue.field_0.func.super_IString.str._M_str);
            r._4_4_ = 1;
            local_a3 = HeapType::operator==(&local_68,(BasicHeapType *)((long)&r + 4));
          }
          if ((local_a3 == false) ||
             (local_78 = Expression::dynCast<wasm::RefFunc>(curr->value), local_78 == (RefFunc *)0x0
             )) {
LAB_0195d304:
            n._0_4_ = 0;
          }
          else {
            local_88 = (string_view)wasm::Literal::getFunc((Literal *)&c);
            wasm::Name::operator=(&local_78->func,(Name *)&local_88);
            RefFunc::finalize(local_78);
            Break::finalize(curr);
            n._0_4_ = 1;
          }
        }
      }
      wasm::Literal::~Literal((Literal *)&c);
      if ((int)n != 0) {
        return;
      }
    }
  }
  module = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                      ).
                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                      .
                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                    );
  pEVar3 = Flow::getConstExpression(flow,module);
  curr->value = pEVar3;
LAB_0195d359:
  Break::finalize(curr);
  return;
}

Assistant:

void reuseConstantNode(T* curr, Flow flow) {
    if (flow.values.isConcrete()) {
      // reuse a const / ref.null / ref.func node if there is one
      if (curr->value && flow.values.size() == 1) {
        Literal singleValue = flow.getSingleValue();
        if (singleValue.type.isNumber()) {
          if (auto* c = curr->value->template dynCast<Const>()) {
            c->value = singleValue;
            c->finalize();
            curr->finalize();
            return;
          }
        } else if (singleValue.isNull()) {
          if (auto* n = curr->value->template dynCast<RefNull>()) {
            n->finalize(singleValue.type);
            curr->finalize();
            return;
          }
        } else if (singleValue.type.isRef() &&
                   singleValue.type.getHeapType() == HeapType::func) {
          if (auto* r = curr->value->template dynCast<RefFunc>()) {
            r->func = singleValue.getFunc();
            r->finalize();
            curr->finalize();
            return;
          }
        }
      }
      curr->value = flow.getConstExpression(*getModule());
    } else {
      curr->value = nullptr;
    }
    curr->finalize();
  }